

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<std::pair<int,_long>,_60>::Resize
          (TPZManVector<std::pair<int,_long>,_60> *this,int64_t newsize,pair<int,_long> *object)

{
  int iVar1;
  pair<int,_long> *ppVar2;
  pair<int,_long> *ppVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<std::pair<int,_long>_>).fNElements;
  if (newsize != lVar7) {
    lVar6 = (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc;
    if (lVar6 < newsize) {
      if ((ulong)newsize < 0x3d) {
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
          lVar4 = 0;
          lVar6 = lVar7;
          do {
            *(undefined4 *)((long)&this->fExtAlloc[0].first + lVar4) =
                 *(undefined4 *)((long)&ppVar2->first + lVar4);
            *(undefined8 *)((long)&this->fExtAlloc[0].second + lVar4) =
                 *(undefined8 *)((long)&ppVar2->second + lVar4);
            lVar4 = lVar4 + 0x10;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        lVar6 = newsize - lVar7;
        if (lVar6 != 0 && lVar7 <= newsize) {
          iVar1 = object->first;
          lVar4 = object->second;
          plVar5 = &this->fExtAlloc[lVar7].second;
          do {
            ((pair<int,_long> *)(plVar5 + -1))->first = iVar1;
            *plVar5 = lVar4;
            plVar5 = plVar5 + 2;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
        if (ppVar2 != (pair<int,_long> *)0x0 && ppVar2 != this->fExtAlloc) {
          operator_delete__(ppVar2);
        }
        (this->super_TPZVec<std::pair<int,_long>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0x3c;
      }
      else {
        dVar9 = (double)lVar6 * 1.2;
        uVar8 = (long)dVar9;
        if (dVar9 < (double)newsize) {
          uVar8 = newsize;
        }
        ppVar2 = (pair<int,_long> *)operator_new__(-(ulong)(uVar8 >> 0x3c != 0) | uVar8 * 0x10);
        if (uVar8 != 0) {
          ppVar3 = ppVar2;
          do {
            ppVar3->first = 0;
            ppVar3->second = 0;
            ppVar3 = ppVar3 + 1;
          } while (ppVar3 != ppVar2 + uVar8);
        }
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          ppVar3 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
          lVar4 = 8;
          lVar6 = lVar7;
          do {
            *(undefined4 *)((long)ppVar2 + lVar4 + -8) = *(undefined4 *)((long)ppVar3 + lVar4 + -8);
            *(undefined8 *)((long)&ppVar2->first + lVar4) =
                 *(undefined8 *)((long)&ppVar3->first + lVar4);
            lVar4 = lVar4 + 0x10;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        lVar6 = newsize - lVar7;
        if (lVar6 != 0 && lVar7 <= newsize) {
          iVar1 = object->first;
          lVar4 = object->second;
          plVar5 = &ppVar2[lVar7].second;
          do {
            ((pair<int,_long> *)(plVar5 + -1))->first = iVar1;
            *plVar5 = lVar4;
            plVar5 = plVar5 + 2;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        ppVar3 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
        if (ppVar3 != (pair<int,_long> *)0x0 && ppVar3 != this->fExtAlloc) {
          operator_delete__(ppVar3);
        }
        (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar2;
        (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar8;
      }
    }
    else {
      lVar6 = newsize - lVar7;
      if (lVar6 != 0 && lVar7 <= newsize) {
        iVar1 = object->first;
        lVar4 = object->second;
        plVar5 = &(this->super_TPZVec<std::pair<int,_long>_>).fStore[lVar7].second;
        do {
          ((pair<int,_long> *)(plVar5 + -1))->first = iVar1;
          *plVar5 = lVar4;
          plVar5 = plVar5 + 2;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}